

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

int Nf_CutCreateUnit(Nf_Cut_t *p,int i)

{
  word wVar1;
  
  p->Delay = 0;
  p->Flow = 0.0;
  *(uint *)&p->field_0x10 = *(uint *)&p->field_0x10 & 0x4000000 | 0x8000002;
  p->pLeaves[0] = i;
  wVar1 = 1L << ((byte)i & 0x3f);
  p->Sign = wVar1;
  return (int)wVar1;
}

Assistant:

static inline int Nf_CutCreateUnit( Nf_Cut_t * p, int i )
{
    p->Delay      = 0;
    p->Flow       = 0;
    p->iFunc      = 2;
    p->nLeaves    = 1;
    p->pLeaves[0] = i;
    p->Sign       = ((word)1) << (i & 0x3F);
    return 1;
}